

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# OptimizeInstructions.cpp
# Opt level: O0

void __thiscall wasm::OptimizeInstructions::visitStore(OptimizeInstructions *this,Store *curr)

{
  byte bVar1;
  bool bVar2;
  uint uVar3;
  Type local_40;
  Unary *local_38;
  Unary *unary;
  char *local_28;
  BasicType local_1c;
  Store *local_18;
  Store *curr_local;
  OptimizeInstructions *this_local;
  
  local_1c = unreachable;
  local_18 = curr;
  curr_local = (Store *)this;
  bVar2 = wasm::Type::operator==
                    (&(curr->super_SpecificExpression<(wasm::Expression::Id)13>).super_Expression.
                      type,&local_1c);
  if (!bVar2) {
    unary = (Unary *)(local_18->memory).super_IString.str._M_len;
    local_28 = (local_18->memory).super_IString.str._M_str;
    optimizeMemoryAccess
              (this,&local_18->ptr,&local_18->offset,(Name)(local_18->memory).super_IString.str);
    optimizeStoredValue(this,&local_18->value,(uint)local_18->bytes);
    local_38 = Expression::dynCast<wasm::Unary>(local_18->value);
    if (local_38 != (Unary *)0x0) {
      if (local_38->op == WrapInt64) {
        wasm::Type::Type(&local_40,i64);
        (local_18->valueType).id = local_40.id;
        local_18->value = local_38->value;
      }
      else if ((((local_18->isAtomic & 1U) == 0) &&
               (bVar2 = Abstract::hasAnyReinterpret(local_38->op), bVar2)) &&
              (bVar1 = local_18->bytes, uVar3 = wasm::Type::getByteSize(&local_18->valueType),
              bVar1 == uVar3)) {
        (local_18->valueType).id = (local_38->value->type).id;
        local_18->value = local_38->value;
      }
    }
  }
  return;
}

Assistant:

void visitStore(Store* curr) {
    if (curr->type == Type::unreachable) {
      return;
    }
    optimizeMemoryAccess(curr->ptr, curr->offset, curr->memory);
    optimizeStoredValue(curr->value, curr->bytes);
    if (auto* unary = curr->value->dynCast<Unary>()) {
      if (unary->op == WrapInt64) {
        // instead of wrapping to 32, just store some of the bits in the i64
        curr->valueType = Type::i64;
        curr->value = unary->value;
      } else if (!curr->isAtomic && Abstract::hasAnyReinterpret(unary->op) &&
                 curr->bytes == curr->valueType.getByteSize()) {
        // f32.store(y, f32.reinterpret_i32(x))  =>  i32.store(y, x)
        // f64.store(y, f64.reinterpret_i64(x))  =>  i64.store(y, x)
        // i32.store(y, i32.reinterpret_f32(x))  =>  f32.store(y, x)
        // i64.store(y, i64.reinterpret_f64(x))  =>  f64.store(y, x)
        curr->valueType = unary->value->type;
        curr->value = unary->value;
      }
    }
  }